

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlOutputBufferClose(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_48;
  undefined *local_40;
  PyObject *pyobj_out;
  xmlOutputBufferPtr out;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlOutputBufferClose",&local_40);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (local_40 == &_Py_NoneStruct) {
      local_48 = (PyObject *)0x0;
    }
    else {
      local_48 = *(PyObject **)(local_40 + 0x10);
    }
    pyobj_out = local_48;
    if (local_48 == (PyObject *)0x0) {
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
    else {
      out._4_4_ = xmlOutputBufferClose(local_48);
      self_local = libxml_intWrap(out._4_4_);
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlOutputBufferClose(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlOutputBufferPtr out;
    PyObject *pyobj_out;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlOutputBufferClose", &pyobj_out))
        return(NULL);
    out = (xmlOutputBufferPtr) PyoutputBuffer_Get(pyobj_out);
    /* Buffer may already have been destroyed elsewhere. This is harmless. */
    if (out == NULL) {
	Py_INCREF(Py_None);
	return(Py_None);
    }

    c_retval = xmlOutputBufferClose(out);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}